

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testrunner.cpp
# Opt level: O0

void runSingleTest(Setup *s,u16 op)

{
  undefined1 local_448 [8];
  Result mor;
  Result mur;
  u16 op_local;
  Setup *s_local;
  
  opcode = op;
  setupTestInstruction(s,0x1000,op);
  Sandbox::prepare(&sandbox,op);
  resetMusashi(s);
  resetMoira(s);
  runBinutils(s,(Result *)(mor.elapsed + 1));
  runMusashi(s,(Result *)(mor.elapsed + 1));
  muclk[0] = mur._512_8_ + muclk[0];
  muclk[1] = mur.elapsed[0] + muclk[1];
  runMoira(s,(Result *)local_448);
  moclk[0] = mor._512_8_ + moclk[0];
  moclk[1] = mor.elapsed[0] + moclk[1];
  compare(s,(Result *)(mor.elapsed + 1),(Result *)local_448);
  return;
}

Assistant:

void runSingleTest(Setup &s, u16 op)
{
    Result mur, mor;

    opcode = op;

    // Prepare the test case with the selected instruction
    setupTestInstruction(s, pc, op);

    // Reset the sandbox (memory accesses observer)
    sandbox.prepare(op);

    // Prepare
    resetMusashi(s);
    resetMoira(s);

    // Run the binutils disassembler
    runBinutils(s, mur);

    // Run Musashi
    runMusashi(s, mur);
    muclk[0] += mur.elapsed[0];
    muclk[1] += mur.elapsed[1];

    // Run Moira
    runMoira(s, mor);
    moclk[0] += mor.elapsed[0];
    moclk[1] += mor.elapsed[1];

    // Compare
    compare(s, mur, mor);
}